

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eumorphic.hpp
# Opt level: O3

void __thiscall
eumorphic::ordered_collection<container,_a,_b,_c>::insert<a>
          (ordered_collection<container,_a,_b,_c> *this,a *value)

{
  iterator __position;
  iterator __position_00;
  unsigned_long local_18;
  
  local_18 = 0;
  __position._M_current =
       (this->types_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->types_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&this->types_order,__position,&local_18);
  }
  else {
    *__position._M_current = 0;
    (this->types_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  __position_00._M_current =
       *(pointer *)
        ((long)&(this->super_collection<container,_a,_b,_c>).data_.storage_.
                super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_std::vector<a,_std::allocator<a>_>,_std::vector<b,_std::allocator<b>_>,_std::vector<c,_std::allocator<c>_>_>
                .super_ebo<boost::hana::detail::bti<0UL>,_std::vector<a,_std::allocator<a>_>,_false>
                .data_.super__Vector_base<a,_std::allocator<a>_> + 8);
  if (__position_00._M_current ==
      *(pointer *)
       ((long)&(this->super_collection<container,_a,_b,_c>).data_.storage_.
               super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_std::vector<a,_std::allocator<a>_>,_std::vector<b,_std::allocator<b>_>,_std::vector<c,_std::allocator<c>_>_>
               .super_ebo<boost::hana::detail::bti<0UL>,_std::vector<a,_std::allocator<a>_>,_false>.
               data_.super__Vector_base<a,_std::allocator<a>_> + 0x10)) {
    std::vector<a,_std::allocator<a>_>::_M_realloc_insert<a>
              ((vector<a,_std::allocator<a>_> *)this,__position_00,value);
  }
  else {
    (__position_00._M_current)->id = value->id;
    *(a **)((long)&(this->super_collection<container,_a,_b,_c>).data_.storage_.
                   super_basic_tuple_impl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_std::vector<a,_std::allocator<a>_>,_std::vector<b,_std::allocator<b>_>,_std::vector<c,_std::allocator<c>_>_>
                   .
                   super_ebo<boost::hana::detail::bti<0UL>,_std::vector<a,_std::allocator<a>_>,_false>
                   .data_.super__Vector_base<a,_std::allocator<a>_> + 8) =
         __position_00._M_current + 1;
  }
  return;
}

Assistant:

constexpr void insert(T&& value)
		{
                        using namespace detail;
						using Td = std::decay_t<T>;
                        constexpr auto  type_index = index_of(Base::segments_container_t, hana::type_c< Container<Td> >);

                        types_order.push_back( type_index );

                        hana::at(Base::data_, type_index).push_back(std::forward<T>(value));
		}